

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitvector.hpp
# Opt level: O0

void __thiscall
bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::bt_impl
          (bt_impl<4096UL,_(bv::allocation_policy_t)0> *this,size_t N,size_t Wn)

{
  undefined1 auVar1 [16];
  bool bVar2;
  long lVar3;
  unsigned_long *puVar4;
  size_t sVar5;
  size_t in_RDX;
  size_t in_RSI;
  bt_impl<4096UL,_(bv::allocation_policy_t)0> *in_RDI;
  undefined1 auVar6 [16];
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  item_reference iVar12;
  size_t level_count;
  size_t minimum_degree;
  bt_impl<4096UL,_(bv::allocation_policy_t)0> *in_stack_ffffffffffffff10;
  subtree_ref_base<false> *this_00;
  unsigned_long local_58;
  unsigned_long local_50;
  size_t local_48;
  size_t local_40;
  unsigned_long local_38;
  unsigned_long local_30 [3];
  size_t local_18;
  size_t local_10;
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  undefined1 extraout_var_01 [56];
  undefined1 extraout_var_02 [56];
  undefined1 extraout_var_03 [56];
  
  in_RDI->capacity = 0;
  in_RDI->node_width = 0;
  in_RDI->counter_width = 0;
  in_RDI->pointer_width = 0;
  in_RDI->degree = 0;
  in_RDI->buffer = 0;
  in_RDI->leaves_count = 0;
  in_RDI->nodes_count = 0;
  in_RDI->size = 0;
  in_RDI->rank = 0;
  in_RDI->height = 0;
  in_RDI->free_node = 0;
  in_RDI->free_leaf = 0;
  local_18 = in_RDX;
  local_10 = in_RSI;
  packed_view<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::data_container>::
  packed_view((packed_view<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::data_container>
               *)in_stack_ffffffffffffff10);
  packed_view<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::data_container>::
  packed_view((packed_view<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::data_container>
               *)in_stack_ffffffffffffff10);
  packed_view<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::data_container>::
  packed_view((packed_view<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::data_container>
               *)in_stack_ffffffffffffff10);
  std::
  deque<bv::internal::bitview<bv::internal::bitarray_t<4096UL>::array>,_std::allocator<bv::internal::bitview<bv::internal::bitarray_t<4096UL>::array>_>_>
  ::deque((deque<bv::internal::bitview<bv::internal::bitarray_t<4096UL>::array>,_std::allocator<bv::internal::bitview<bv::internal::bitarray_t<4096UL>::array>_>_>
           *)0x135a57);
  in_RDI->capacity = local_10;
  bVar2 = small(in_RDI);
  if (bVar2) {
    in_RDI->leaves_count = 1;
    alloc_leaf(in_stack_ffffffffffffff10);
  }
  else {
    in_RDI->node_width = local_18;
    auVar7._0_8_ = std::log2<unsigned_long>(0x135b21);
    auVar7._8_56_ = extraout_var;
    auVar1 = vroundsd_avx(auVar7._0_16_,auVar7._0_16_,9);
    auVar6._8_8_ = 0;
    auVar6._0_8_ = auVar1._0_8_ + 1.0;
    lVar3 = vcvttsd2usi_avx512f(auVar6);
    in_RDI->counter_width = lVar3 + 1;
    in_RDI->degree = in_RDI->node_width / in_RDI->counter_width;
    auVar8._0_8_ = std::sqrt<unsigned_long>(in_RDI->degree);
    auVar8._8_56_ = extraout_var_00;
    auVar1 = vroundsd_avx(auVar8._0_16_,auVar8._0_16_,10);
    local_30[0] = vcvttsd2usi_avx512f(auVar1);
    local_38 = 1;
    puVar4 = std::max<unsigned_long>(local_30,&local_38);
    in_RDI->buffer = *puVar4;
    while( true ) {
      auVar9._0_8_ = std::floor<unsigned_long>((in_RDI->degree + 1) / in_RDI->buffer);
      auVar9._8_56_ = extraout_var_01;
      auVar1 = vcvtusi2sd_avx512f(auVar9._0_16_,in_RDI->buffer);
      if (auVar1._0_8_ <= auVar9._0_8_) break;
      in_RDI->buffer = in_RDI->buffer - 1;
    }
    sVar5 = in_RDI->buffer;
    auVar10._0_8_ =
         std::ceil<unsigned_long>(in_RDI->capacity / ((sVar5 * (0x1000 - sVar5)) / (sVar5 + 1)));
    auVar10._8_56_ = extraout_var_02;
    lVar3 = vcvttsd2usi_avx512f(auVar10._0_16_);
    in_RDI->leaves_count = lVar3 + 1;
    local_40 = in_RDI->buffer;
    in_RDI->nodes_count = 0;
    local_48 = in_RDI->leaves_count;
    do {
      local_48 = ceildiv(local_48,local_40);
      in_RDI->nodes_count = local_48 + in_RDI->nodes_count;
    } while (1 < local_48);
    local_50 = in_RDI->buffer + 1;
    puVar4 = std::max<unsigned_long>(&in_RDI->leaves_count,&local_50);
    in_RDI->leaves_count = *puVar4;
    this_00 = (subtree_ref_base<false> *)&in_RDI->nodes_count;
    local_58 = in_RDI->buffer + 1;
    puVar4 = std::max<unsigned_long>((unsigned_long *)this_00,&local_58);
    in_RDI->nodes_count = *puVar4;
    std::max<unsigned_long>((unsigned_long *)this_00,&in_RDI->leaves_count);
    auVar11._0_8_ = std::log2<unsigned_long>(0x135d3b);
    auVar11._8_56_ = extraout_var_03;
    auVar1 = vroundsd_avx(auVar11._0_16_,auVar11._0_16_,10);
    sVar5 = vcvttsd2usi_avx512f(auVar1);
    in_RDI->pointer_width = sVar5;
    in_RDI->height = 1;
    alloc_node(in_stack_ffffffffffffff10);
    alloc_leaf(in_stack_ffffffffffffff10);
    sVar5 = alloc_leaf(in_stack_ffffffffffffff10);
    root(in_stack_ffffffffffffff10);
    iVar12 = subtree_ref_base<false>::pointers(this_00,sVar5);
    item_reference<bv::internal::packed_view<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::data_container>_>
    ::operator=((item_reference<bv::internal::packed_view<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::data_container>_>
                 *)iVar12._v,iVar12._index);
  }
  return;
}

Assistant:

bt_impl<W, AP>::bt_impl(size_t N, size_t Wn)
        {
            capacity = N;
            
            // When all the maximum capacity fits in a leaf, we act consequently
            if(small()) {
                // We only need one leaf
                leaves_count = 1;
                alloc_leaf();
                return;
            }
            
            node_width = Wn;
            
            // The + 1 at the end is for the extra flag bit
            counter_width = size_t(floor(log2(capacity)) + 1) + 1;
            
            degree = node_width / counter_width;
            
            for(buffer = max(size_t(ceil(sqrt(degree))), size_t(1));
                floor((degree + 1)/buffer) < buffer;
                --buffer);
            
            // Maximum number of leaves needed in the worst case
            leaves_count = size_t(ceil(capacity / ((buffer *
                                                    (leaf_bits - buffer))
                                                  / (buffer + 1))))
                           + 1; // for the sentinel leaf at index 0
            
            size_t minimum_degree = buffer;
            
            // Total number of internal nodes
            nodes_count = 0;
            size_t level_count = leaves_count;
            do
            {
                level_count = ceildiv(level_count, minimum_degree);
                nodes_count += level_count;
            } while(level_count > 1);
            
            // For values of small capacity relatively to the leaves and nodes
            // bit size, the buffer could be greater than the maximum count.
            leaves_count = max(leaves_count, buffer + 1);
            nodes_count = max(nodes_count, buffer + 1);
            
            // Width of pointers
            pointer_width = size_t(ceil(log2(max(nodes_count, leaves_count))));
            
            assert(pointer_width <= counter_width);
            assert(pointer_width * (degree + 1) <= node_width);
            
            // Allocate all the needed memory ahead of time if the policy says so
            if(AP == alloc_immediatly) {
                reserve_nodes(nodes_count);
                leaves.resize(leaves_count);
            }
            
            // Allocate space for the root node and its first leaf
            height = 1; // Initial height is 1
            alloc_node(); // Initial root node
            alloc_leaf(); // Sentinel leaf for position zero
            root().pointers(0) = alloc_leaf(); // First leaf
        }